

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_generate_key(psa_key_attributes_t *attributes,psa_key_handle_t *handle)

{
  size_t sVar1;
  psa_se_drv_table_entry_t *local_38;
  psa_se_drv_table_entry_t *driver;
  psa_key_slot_t *slot;
  psa_key_handle_t *ppStack_20;
  psa_status_t status;
  psa_key_handle_t *handle_local;
  psa_key_attributes_t *attributes_local;
  
  driver = (psa_se_drv_table_entry_t *)0x0;
  local_38 = (psa_se_drv_table_entry_t *)0x0;
  ppStack_20 = handle;
  handle_local = (psa_key_handle_t *)attributes;
  sVar1 = psa_get_key_bits(attributes);
  if (sVar1 == 0) {
    attributes_local._4_4_ = -0x87;
  }
  else {
    slot._4_4_ = psa_start_key_creation
                           (PSA_KEY_CREATION_GENERATE,(psa_key_attributes_t *)handle_local,
                            ppStack_20,(psa_key_slot_t **)&driver,&local_38);
    if (slot._4_4_ == 0) {
      slot._4_4_ = psa_generate_key_internal
                             ((psa_key_slot_t *)driver,(ulong)handle_local[1],
                              *(uint8_t **)(handle_local + 0x10),*(size_t *)(handle_local + 0x14));
    }
    if (slot._4_4_ == 0) {
      slot._4_4_ = psa_finish_key_creation((psa_key_slot_t *)driver,local_38);
    }
    if (slot._4_4_ != 0) {
      psa_fail_key_creation((psa_key_slot_t *)driver,local_38);
      *ppStack_20 = 0;
    }
    attributes_local._4_4_ = slot._4_4_;
  }
  return attributes_local._4_4_;
}

Assistant:

psa_status_t psa_generate_key( const psa_key_attributes_t *attributes,
                               psa_key_handle_t *handle )
{
    psa_status_t status;
    psa_key_slot_t *slot = NULL;
    psa_se_drv_table_entry_t *driver = NULL;

    /* Reject any attempt to create a zero-length key so that we don't
     * risk tripping up later, e.g. on a malloc(0) that returns NULL. */
    if( psa_get_key_bits( attributes ) == 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    status = psa_start_key_creation( PSA_KEY_CREATION_GENERATE,
                                     attributes, handle, &slot, &driver );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        const psa_drv_se_t *drv = psa_get_se_driver_methods( driver );
        size_t pubkey_length = 0; /* We don't support this feature yet */
        if( drv->key_management == NULL ||
            drv->key_management->p_generate == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = drv->key_management->p_generate(
            psa_get_se_driver_context( driver ),
            slot->data.se.slot_number, attributes,
            NULL, 0, &pubkey_length );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
    {
        status = psa_generate_key_internal(
            slot, attributes->core.bits,
            attributes->domain_parameters, attributes->domain_parameters_size );
    }

exit:
    if( status == PSA_SUCCESS )
        status = psa_finish_key_creation( slot, driver );
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( slot, driver );
        *handle = 0;
    }
    return( status );
}